

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net_processing.cpp
# Opt level: O2

bool __thiscall
anon_unknown.dwarf_1cfc8e::PeerManagerImpl::BlockRequestAllowed
          (PeerManagerImpl *this,CBlockIndex *pindex)

{
  long lVar1;
  CBlockIndex *to;
  bool bVar2;
  bool bVar3;
  Chainstate *pCVar4;
  int64_t iVar5;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  pCVar4 = ChainstateManager::ActiveChainstate(this->m_chainman);
  bVar2 = CChain::Contains(&pCVar4->m_chain,pindex);
  bVar3 = true;
  if (!bVar2) {
    if ((((pindex->nStatus & 7) < 5 || (pindex->nStatus & 0x60) != 0) ||
        (to = this->m_chainman->m_best_header, to == (CBlockIndex *)0x0)) ||
       (0x278cff < (long)((ulong)to->nTime - (ulong)pindex->nTime))) {
      bVar3 = false;
    }
    else {
      iVar5 = GetBlockProofEquivalentTime(to,pindex,to,&this->m_chainparams->consensus);
      bVar3 = iVar5 < 0x278d00;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return bVar3;
  }
  __stack_chk_fail();
}

Assistant:

bool PeerManagerImpl::BlockRequestAllowed(const CBlockIndex* pindex)
{
    AssertLockHeld(cs_main);
    if (m_chainman.ActiveChain().Contains(pindex)) return true;
    return pindex->IsValid(BLOCK_VALID_SCRIPTS) && (m_chainman.m_best_header != nullptr) &&
           (m_chainman.m_best_header->GetBlockTime() - pindex->GetBlockTime() < STALE_RELAY_AGE_LIMIT) &&
           (GetBlockProofEquivalentTime(*m_chainman.m_best_header, *pindex, *m_chainman.m_best_header, m_chainparams.GetConsensus()) < STALE_RELAY_AGE_LIMIT);
}